

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O0

int archive_write_pax_header_xattrs(archive_write *a,pax *pax,archive_entry *entry)

{
  wchar_t wVar1;
  char *__s;
  wchar_t *as;
  int *piVar2;
  size_t local_78;
  size_t sStack_58;
  int r;
  size_t size;
  char *encoded_name;
  char *url_encoded_name;
  void *value;
  char *name;
  archive_entry *paStack_28;
  int i;
  archive_entry *entry_local;
  pax *pax_local;
  archive_write *a_local;
  
  paStack_28 = entry;
  entry_local = (archive_entry *)pax;
  pax_local = (pax *)a;
  name._4_4_ = archive_entry_xattr_reset(entry);
  do {
    if (name._4_4_ == L'\0') {
      return 0;
    }
    encoded_name = (char *)0x0;
    size = 0;
    name._4_4_ = name._4_4_ + L'\xffffffff';
    archive_entry_xattr_next(paStack_28,(char **)&value,&url_encoded_name,&stack0xffffffffffffffa8);
    __s = url_encode((char *)value);
    encoded_name = __s;
    if (__s != (char *)0x0) {
      as = &entry_local->stat_valid;
      if (__s == (char *)0x0) {
        local_78 = 0;
      }
      else {
        local_78 = strlen(__s);
      }
      wVar1 = archive_strncpy_l((archive_string *)as,__s,local_78,
                                (archive_string_conv *)(entry_local->ae_stat).aest_size);
      free(encoded_name);
      if (wVar1 == L'\0') {
        size = *(size_t *)&entry_local->stat_valid;
      }
      else {
        piVar2 = __errno_location();
        if (*piVar2 == 0xc) {
          archive_set_error((archive *)pax_local,0xc,"Can\'t allocate memory for Linkname");
          return -0x1e;
        }
      }
    }
    archive_write_pax_header_xattr((pax *)entry_local,(char *)size,url_encoded_name,sStack_58);
  } while( true );
}

Assistant:

static int
archive_write_pax_header_xattrs(struct archive_write *a,
    struct pax *pax, struct archive_entry *entry)
{
	int i = archive_entry_xattr_reset(entry);

	while (i--) {
		const char *name;
		const void *value;
		char *url_encoded_name = NULL, *encoded_name = NULL;
		size_t size;
		int r;

		archive_entry_xattr_next(entry, &name, &value, &size);
		url_encoded_name = url_encode(name);
		if (url_encoded_name != NULL) {
			/* Convert narrow-character to UTF-8. */
			r = archive_strcpy_l(&(pax->l_url_encoded_name),
			    url_encoded_name, pax->sconv_utf8);
			free(url_encoded_name); /* Done with this. */
			if (r == 0)
				encoded_name = pax->l_url_encoded_name.s;
			else if (errno == ENOMEM) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory for Linkname");
				return (ARCHIVE_FATAL);
			}
		}

		archive_write_pax_header_xattr(pax, encoded_name,
		    value, size);

	}
	return (ARCHIVE_OK);
}